

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void lws_context_destroy(lws_context *context)

{
  lws_vhost *plVar1;
  bool bVar2;
  lws_context_per_thread *pt_00;
  int iVar3;
  lws_vhost *vhn;
  lws_context_per_thread *pt;
  int deferred_pt;
  int m;
  lws_vhost *vh;
  lws_context *context_local;
  
  _deferred_pt = (lws_vhost *)0x0;
  bVar2 = false;
  if ((context != (lws_context *)0x0) && ((*(ushort *)&context->field_0x510 >> 1 & 1) == 0)) {
    *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xfffd | 2;
    if ((*(ushort *)&context->field_0x510 >> 9 & 1) == 0) {
      if ((*(ushort *)&context->field_0x510 >> 3 & 1) == 0) {
        _lws_log(8,"%s: ctx %p\n","lws_context_destroy",context);
        *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xfffb | 4;
        lws_state_transition(&context->mgr_system,0xb);
        pt._4_4_ = (int)context->count_threads;
        while (iVar3 = pt._4_4_ + -1, pt._4_4_ != 0) {
          pt_00 = context->pt + iVar3;
          pt._4_4_ = iVar3;
          if (((byte)pt_00->field_0x187 >> 5 & 1) == 0) {
            if (((byte)pt_00->field_0x187 >> 1 & 1) == 0) {
              lws_pt_destroy(pt_00);
            }
            else {
              pt_00->field_0x187 = pt_00->field_0x187 & 0xef | 0x10;
              bVar2 = true;
            }
          }
        }
        if (bVar2) {
          _lws_log(8,"%s: waiting for deferred pt close\n","lws_context_destroy");
          lws_cancel_service(context);
        }
        else {
          *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xfff7 | 8;
          *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xffdf | 0x20;
          if ((*(ushort *)&context->field_0x510 >> 6 & 1) != 0) {
            _deferred_pt = context->vhost_list;
          }
          while (_deferred_pt != (lws_vhost *)0x0) {
            plVar1 = _deferred_pt->vhost_next;
            lws_vhost_destroy1(_deferred_pt);
            _deferred_pt = plVar1;
          }
          lws_plat_context_early_destroy(context);
          if (context->event_loop_ops->destroy_context1 == (_func_int_lws_context_ptr *)0x0) {
            *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xfffd;
            lws_context_destroy2(context);
            return;
          }
          (*context->event_loop_ops->destroy_context1)(context);
        }
        *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xfffd;
      }
      else if ((*(ushort *)&context->field_0x510 >> 4 & 1) == 0) {
        lws_context_destroy2(context);
      }
      else {
        _lws_log(8,"%s: ctx %p: already being destroyed\n","lws_context_destroy",context);
        lws_context_destroy3(context);
      }
    }
    else {
      if (context->event_loop_ops->destroy_context2 != (_func_int_lws_context_ptr *)0x0) {
        (*context->event_loop_ops->destroy_context2)(context);
      }
      lws_context_destroy3(context);
    }
  }
  return;
}

Assistant:

void
lws_context_destroy(struct lws_context *context)
{
#if defined(LWS_WITH_NETWORK)
	struct lws_vhost *vh = NULL;
	int m, deferred_pt = 0;
#endif

	if (!context || context->inside_context_destroy)
		return;

	context->inside_context_destroy = 1;

#if defined(LWS_WITH_NETWORK)
	if (context->finalize_destroy_after_internal_loops_stopped) {
		if (context->event_loop_ops->destroy_context2)
			context->event_loop_ops->destroy_context2(context);
		lws_context_destroy3(context);
		/* context is invalid, no need to reset inside flag */
		return;
	}
#endif
	if (context->being_destroyed1) {
		if (!context->being_destroyed2) {
			lws_context_destroy2(context);

			return;
		}
		lwsl_info("%s: ctx %p: already being destroyed\n",
			    __func__, context);

		lws_context_destroy3(context);
		/* context is invalid, no need to reset inside flag */
		return;
	}

	lwsl_info("%s: ctx %p\n", __func__, context);

	context->being_destroyed = 1;

#if defined(LWS_WITH_NETWORK)
	lws_state_transition(&context->mgr_system, LWS_SYSTATE_POLICY_INVALID);
	m = context->count_threads;

	while (m--) {
		struct lws_context_per_thread *pt = &context->pt[m];

		if (pt->is_destroyed)
			continue;

		if (pt->inside_lws_service) {
			pt->destroy_self = 1;
			deferred_pt = 1;
			continue;
		}

		lws_pt_destroy(pt);
	}

	if (deferred_pt) {
		lwsl_info("%s: waiting for deferred pt close\n", __func__);
		lws_cancel_service(context);
		goto out;
	}

	context->being_destroyed1 = 1;
	context->requested_kill = 1;

	/*
	 * inform all the protocols that they are done and will have no more
	 * callbacks.
	 *
	 * We can't free things until after the event loop shuts down.
	 */
	if (context->protocol_init_done)
		vh = context->vhost_list;
	while (vh) {
		struct lws_vhost *vhn = vh->vhost_next;
		lws_vhost_destroy1(vh);
		vh = vhn;
	}
#endif

	lws_plat_context_early_destroy(context);

#if defined(LWS_WITH_NETWORK)

	/*
	 * We face two different needs depending if foreign loop or not.
	 *
	 * 1) If foreign loop, we really want to advance the destroy_context()
	 *    past here, and block only for libuv-style async close completion.
	 *
	 * 2a) If poll, and we exited by ourselves and are calling a final
	 *     destroy_context() outside of any service already, we want to
	 *     advance all the way in one step.
	 *
	 * 2b) If poll, and we are reacting to a SIGINT, service thread(s) may
	 *     be in poll wait or servicing.  We can't advance the
	 *     destroy_context() to the point it's freeing things; we have to
	 *     leave that for the final destroy_context() after the service
	 *     thread(s) are finished calling for service.
	 */

	if (context->event_loop_ops->destroy_context1) {
		context->event_loop_ops->destroy_context1(context);

		goto out;
	}
#endif

#if defined(LWS_PLAT_FREERTOS)
#if defined(LWS_AMAZON_RTOS)
	context->last_free_heap = xPortGetFreeHeapSize();
#else
	context->last_free_heap = esp_get_free_heap_size();
#endif
#endif

	context->inside_context_destroy = 0;
	lws_context_destroy2(context);

	return;

#if defined(LWS_WITH_NETWORK)
out:
	context->inside_context_destroy = 0;
#endif
}